

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  long lVar1;
  Ch *pCVar2;
  undefined7 in_register_00000009;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  StringRefType local_28;
  
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(this->stack_).stackTop_;
  lVar1 = (long)(this->stack_).stackEnd_ - (long)this_00;
  if ((int)CONCAT71(in_register_00000009,copy) == 0) {
    if (lVar1 < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)(this->stack_).stackTop_;
    }
    (this->stack_).stackTop_ = (char *)(this_00 + 1);
    (this_00->data_).n = (Number)0x0;
    (this_00->data_).s.str = (Ch *)0x0;
    pCVar2 = "";
    if (str != (Ch *)0x0) {
      pCVar2 = str;
    }
    (this_00->data_).s.str = (Ch *)((ulong)pCVar2 | 0x405000000000000);
    (this_00->data_).s.length = length;
  }
  else {
    if (lVar1 < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)(this->stack_).stackTop_;
    }
    (this->stack_).stackTop_ = (char *)(this_00 + 1);
    allocator = this->allocator_;
    local_28.s = "";
    if (str != (Ch *)0x0) {
      local_28.s = str;
    }
    (this_00->data_).n = (Number)0x0;
    (this_00->data_).s.str = (Ch *)0x0;
    local_28.length = length;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetStringRaw(this_00,&local_28,allocator);
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) { 
        if (copy) 
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }